

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac.c
# Opt level: O2

int omac_imit_ctrl(EVP_MD_CTX *ctx,int type,int arg,void *ptr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  EVP_CIPHER *cipher;
  OMAC_CTX *pOVar5;
  EVP_MD *pEVar6;
  long lVar7;
  EVP_CIPHER *cipher_00;
  code *pcVar8;
  void *key_size;
  int iVar9;
  char *name;
  uchar diversed_key [32];
  
  if (type == 3) {
    lVar7 = EVP_MD_CTX_get0_md_data(ctx);
    iVar4 = OBJ_txt2nid(*(char **)(lVar7 + 0x10));
    if (iVar4 == 0x3f7) {
      if (0xffffffef < arg - 0x11U) goto LAB_00118634;
      iVar9 = 0x75;
      iVar4 = 0xe3;
    }
    else {
      if (iVar4 != 0x4a6) {
        return 0;
      }
      if (0xfffffff7 < arg - 9U) {
LAB_00118634:
        *(ulong *)(lVar7 + 8) = (ulong)(uint)arg;
        return 1;
      }
      iVar9 = 0x75;
      iVar4 = 0xdc;
    }
LAB_0011862a:
    ERR_GOST_error(0x74,iVar9,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac.c"
                   ,iVar4);
    return 0;
  }
  if (type == 4) {
    pOVar5 = (OMAC_CTX *)EVP_MD_CTX_get0_md_data(ctx);
    if (pOVar5->key_set == 0) {
      iVar9 = 0x84;
      iVar4 = 0xff;
      goto LAB_0011862a;
    }
    iVar4 = OBJ_txt2nid(pOVar5->cipher_name);
    iVar4 = gost_tlstree(iVar4,pOVar5->key,diversed_key,(uchar *)ptr);
    if (iVar4 == 0) {
      return 0;
    }
    cipher = EVP_get_cipherbyname(pOVar5->cipher_name);
    if (cipher == (EVP_CIPHER *)0x0) {
      iVar4 = 0;
      cipher = (EVP_CIPHER *)EVP_CIPHER_fetch(0,pOVar5->cipher_name,0);
      cipher_00 = (EVP_CIPHER *)0x0;
      if (cipher == (EVP_CIPHER *)0x0) goto LAB_001186f0;
    }
    iVar4 = omac_key(pOVar5,(EVP_CIPHER *)cipher,diversed_key,(size_t)ptr);
    cipher_00 = cipher;
    goto LAB_001186f0;
  }
  if (type != 0x1004) {
    if (type == 0x1003) {
      *(undefined4 *)ptr = 0x20;
      return 1;
    }
    return 0;
  }
  key_size = ptr;
  pOVar5 = (OMAC_CTX *)EVP_MD_CTX_get0_md_data(ctx);
  pEVar6 = EVP_MD_CTX_md((EVP_MD_CTX *)ctx);
  name = pOVar5->cipher_name;
  if (name == (char *)0x0) {
    iVar4 = EVP_MD_is_a(pEVar6,"magma-mac");
    if (iVar4 == 0) {
      iVar4 = EVP_MD_is_a(pEVar6,"kuznyechik-mac");
      if (iVar4 == 0) {
        name = pOVar5->cipher_name;
        goto LAB_0011866c;
      }
      name = "kuznyechik-cbc";
    }
    else {
      name = "magma-cbc";
    }
    pOVar5->cipher_name = name;
  }
LAB_0011866c:
  cipher_00 = EVP_get_cipherbyname(name);
  if (cipher_00 == (EVP_CIPHER *)0x0) {
    iVar4 = 0;
    cipher_00 = (EVP_CIPHER *)EVP_CIPHER_fetch(0,pOVar5->cipher_name,0);
    if (cipher_00 == (EVP_CIPHER *)0x0) {
      ERR_GOST_error(0x74,0x67,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac.c"
                     ,0xb4);
      cipher_00 = (EVP_CIPHER *)0x0;
      goto LAB_001186f0;
    }
  }
  pEVar6 = EVP_MD_CTX_md((EVP_MD_CTX *)ctx);
  pcVar8 = (code *)EVP_MD_meth_get_init(pEVar6);
  iVar4 = (*pcVar8)(ctx);
  if (iVar4 < 1) {
    iVar9 = 0x79;
    iVar4 = 0xb9;
LAB_001186e6:
    ERR_GOST_error(0x74,iVar9,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac.c"
                   ,iVar4);
  }
  else {
    EVP_MD_CTX_set_flags((EVP_MD_CTX *)ctx,0x100);
    if (pOVar5->key_set != 0) {
      iVar9 = 0x84;
      iVar4 = 0xbf;
      goto LAB_001186e6;
    }
    if (arg != 0x20) {
      if (arg != 0) {
        iVar9 = 0x73;
        iVar4 = 0xcf;
        goto LAB_001186e6;
      }
      ptr = (void *)((long)ptr + 4);
    }
    iVar4 = omac_key(pOVar5,(EVP_CIPHER *)cipher_00,(uchar *)ptr,(size_t)key_size);
    if (iVar4 != 0) {
      uVar1 = *ptr;
      uVar2 = *(undefined8 *)((long)ptr + 8);
      uVar3 = *(undefined8 *)((long)ptr + 0x18);
      *(undefined8 *)(pOVar5->key + 0x10) = *(undefined8 *)((long)ptr + 0x10);
      *(undefined8 *)(pOVar5->key + 0x18) = uVar3;
      *(undefined8 *)pOVar5->key = uVar1;
      *(undefined8 *)(pOVar5->key + 8) = uVar2;
      iVar4 = 1;
      goto LAB_001186f0;
    }
  }
  iVar4 = 0;
LAB_001186f0:
  EVP_CIPHER_free(cipher_00);
  return iVar4;
}

Assistant:

int omac_imit_ctrl(EVP_MD_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_MD_CTRL_KEY_LEN:
        *((unsigned int *)(ptr)) = 32;
        return 1;
    case EVP_MD_CTRL_SET_KEY:
        {
            OMAC_CTX *c = EVP_MD_CTX_md_data(ctx);
            const EVP_MD *md = EVP_MD_CTX_md(ctx);
            EVP_CIPHER *cipher = NULL;
            int ret = 0;

            if (c->cipher_name == NULL) {
                if (EVP_MD_is_a(md, SN_magma_mac))
                    c->cipher_name = SN_magma_cbc;
                else if (EVP_MD_is_a(md, SN_grasshopper_mac))
                    c->cipher_name = SN_grasshopper_cbc;
            }
            if ((cipher =
                 (EVP_CIPHER *)EVP_get_cipherbyname(c->cipher_name)) == NULL
                && (cipher =
                    EVP_CIPHER_fetch(NULL, c->cipher_name, NULL)) == NULL) {
                GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_CIPHER_NOT_FOUND);
                goto set_key_end;
            }

            if (EVP_MD_meth_get_init(EVP_MD_CTX_md(ctx)) (ctx) <= 0) {
                GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_MAC_KEY_NOT_SET);
                goto set_key_end;
            }
            EVP_MD_CTX_set_flags(ctx, EVP_MD_CTX_FLAG_NO_INIT);

            if (c->key_set) {
                GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_BAD_ORDER);
                goto set_key_end;
            }

            if (arg == 0) {
                struct gost_mac_key *key = (struct gost_mac_key *)ptr;
                ret = omac_key(c, cipher, key->key, 32);
                if (ret > 0)
                    memcpy(c->key, key->key, 32);
                goto set_key_end;
            } else if (arg == 32) {
                ret = omac_key(c, cipher, ptr, 32);
                if (ret > 0)
                    memcpy(c->key, ptr, 32);
                goto set_key_end;
            }
            GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_INVALID_MAC_KEY_SIZE);
          set_key_end:
            EVP_CIPHER_free(cipher);
            if (ret > 0)
                return ret;
            return 0;
        }
    case EVP_MD_CTRL_XOF_LEN:   /* Supported in OpenSSL */
        {
            OMAC_CTX *c = EVP_MD_CTX_md_data(ctx);
            switch (OBJ_txt2nid(c->cipher_name)) {
            case NID_magma_cbc:
                if (arg < 1 || arg > 8) {
                    GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_INVALID_MAC_SIZE);
                    return 0;
                }
                c->dgst_size = arg;
                break;
            case NID_grasshopper_cbc:
                if (arg < 1 || arg > 16) {
                    GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_INVALID_MAC_SIZE);
                    return 0;
                }
                c->dgst_size = arg;
                break;
            default:
                return 0;
            }
            return 1;
        }
#ifdef EVP_MD_CTRL_TLSTREE
    case EVP_MD_CTRL_TLSTREE:
        {
            OMAC_CTX *c = EVP_MD_CTX_md_data(ctx);
            if (c->key_set) {
                unsigned char diversed_key[32];
                int ret = 0;
                if (gost_tlstree(OBJ_txt2nid(c->cipher_name),
                                 c->key, diversed_key,
                                 (const unsigned char *)ptr)) {
                    EVP_CIPHER *cipher;
                    if ((cipher = (EVP_CIPHER *)EVP_get_cipherbyname(c->cipher_name))
                        || (cipher = EVP_CIPHER_fetch(NULL, c->cipher_name, NULL)))
                        ret = omac_key(c, cipher, diversed_key, 32);
                    EVP_CIPHER_free(cipher);
                }
                return ret;
            }
            GOSTerr(GOST_F_OMAC_IMIT_CTRL, GOST_R_BAD_ORDER);
            return 0;
        }
#endif
    default:
        return 0;
    }
}